

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O2

int __thiscall QtMWidgets::NavigationBarPrivate::init(NavigationBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QStackedWidget *this_00;
  NavigationButton *pNVar2;
  TextLabel *this_01;
  QPalette *this_02;
  QColor *c;
  QVBoxLayout *this_03;
  QGridLayout *pQVar3;
  QFont f;
  code *local_48;
  undefined8 uStack_40;
  Object local_30 [8];
  Object local_28 [8];
  
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  this_00 = (QStackedWidget *)operator_new(0x28);
  QStackedWidget::QStackedWidget(this_00,&this->q->super_QWidget);
  this->stack = this_00;
  QFrame::setFrameStyle((int)this_00);
  pNVar2 = (NavigationButton *)operator_new(0x30);
  NavigationButton::NavigationButton(pNVar2,Left,&this->q->super_QWidget);
  this->left = pNVar2;
  pNVar2 = (NavigationButton *)operator_new(0x30);
  NavigationButton::NavigationButton(pNVar2,Right,&this->q->super_QWidget);
  this->right = pNVar2;
  this_01 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(this_01,&this->q->super_QWidget,(WindowFlags)0x0);
  this->title = this_01;
  this_02 = (QPalette *)QWidget::palette();
  c = QPalette::color(this_02,Highlight);
  TextLabel::setColor(this_01,c);
  local_48 = NavigationBar::showPreviousScreen;
  uStack_40 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QtMWidgets::NavigationBar::*)()>
            (local_28,(offset_in_QAbstractButton_to_subr)this->left,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this->q);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  local_48 = NavigationBar::showNextScreen;
  uStack_40 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QtMWidgets::NavigationBar::*)()>
            (local_30,(offset_in_QAbstractButton_to_subr)this->right,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this->q);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  TextLabel::textOption((TextLabel *)&local_48);
  local_48 = (code *)((ulong)local_48 & 0xffffffffffffe000 | 0x84);
  TextLabel::setTextOption(this->title,(QTextOption *)&local_48);
  QFont::QFont(&f,(QFont *)(*(long *)&this->title->field_0x20 + 0x38));
  QFont::setWeight((Weight)&f);
  QFont::pointSize();
  QFont::setPointSize((int)&f);
  TextLabel::setFont(this->title,&f);
  this_03 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_03,&this->q->super_QWidget);
  (**(code **)(*(long *)this_03 + 0x68))(this_03,0);
  QLayout::setContentsMargins((int)this_03,3,3,3);
  pQVar3 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar3,(QWidget *)0x0);
  this->grid = pQVar3;
  QGridLayout::addWidget(pQVar3,this->left,0,0,0);
  QGridLayout::addWidget(this->grid,this->title,0,1,0);
  QGridLayout::addWidget(this->grid,this->right,0,2,0);
  pQVar3 = this->grid;
  FingerGeometry::height();
  QGridLayout::setRowMinimumHeight((int)pQVar3,0);
  QWidget::hide();
  QWidget::hide();
  QBoxLayout::addLayout((QLayout *)this_03,(int)this->grid);
  QBoxLayout::addWidget(this_03,this->stack,0,0);
  QFont::~QFont(&f);
  iVar1 = QTextOption::~QTextOption((QTextOption *)&local_48);
  return iVar1;
}

Assistant:

void
NavigationBarPrivate::init()
{
	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );

	stack = new QStackedWidget( q );
	stack->setFrameStyle( QFrame::NoFrame | QFrame::Plain );

	left = new NavigationButton( NavigationButton::Left, q );
	right = new NavigationButton( NavigationButton::Right, q );
	title = new TextLabel( q );
	title->setColor( q->palette().color( QPalette::Highlight ) );

	QObject::connect( left, &NavigationButton::clicked,
		q, &NavigationBar::showPreviousScreen );
	QObject::connect( right, &NavigationButton::clicked,
		q, &NavigationBar::showNextScreen );

	QTextOption opt = title->textOption();
	opt.setAlignment( Qt::AlignCenter );
	opt.setWrapMode( QTextOption::NoWrap );

	title->setTextOption( opt );

	QFont f = title->font();
	f.setBold( true );
	f.setPointSize( f.pointSize() + 1 );

	title->setFont( f );

	QVBoxLayout * layout = new QVBoxLayout( q );
	layout->setSpacing( 0 );
	layout->setContentsMargins( 3, 3, 3, 3 );

	grid = new QGridLayout;
	grid->addWidget( left, 0, 0 );
	grid->addWidget( title, 0, 1 );
	grid->addWidget( right, 0, 2 );
	grid->setRowMinimumHeight( 0, FingerGeometry::height() );

	left->hide();
	right->hide();

	layout->addLayout( grid );
	layout->addWidget( stack );
}